

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCipher.cpp
# Opt level: O2

uint16_t __thiscall
security::SimpleCipher::Tag(SimpleCipher *this,uint8_t *data,uint bytes,uint64_t nonce)

{
  uint64_t uVar1;
  
  uVar1 = t1ha(data,(ulong)bytes,nonce ^ *(ulong *)this->ExpandedKey);
  return (uint16_t)(uVar1 >> 0x13);
}

Assistant:

uint16_t SimpleCipher::Tag(const uint8_t* data, unsigned bytes, uint64_t nonce)
{
#ifdef SECURITY_ENABLE_CHECKSUMS
    const uint64_t key = ((uint64_t)ExpandedKey[1] << 32) | ExpandedKey[0];
    const uint64_t tag64 = t1ha(data, bytes, nonce ^ key);
    return (uint16_t)(tag64 >> 19);
#else // SECURITY_ENABLE_CHECKSUMS
    SECURITY_UNUSED(data); SECURITY_UNUSED(bytes); SECURITY_UNUSED(nonce);
    return 0;
#endif // SECURITY_ENABLE_CHECKSUMS
}